

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O2

void de::FilePath_selfTest(void)

{
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  FilePath local_38;
  
  FilePath::FilePath((FilePath *)&local_c0,".");
  bVar1 = FilePath::isAbsolutePath((FilePath *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (bVar1) {
    deAssertFail("!FilePath(\".\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xd8);
  }
  FilePath::FilePath((FilePath *)&local_c0,"..\\foo");
  bVar1 = FilePath::isAbsolutePath((FilePath *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (bVar1) {
    deAssertFail("!FilePath(\"..\\\\foo\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xd9);
  }
  FilePath::FilePath((FilePath *)&local_c0,"foo");
  bVar1 = FilePath::isAbsolutePath((FilePath *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (bVar1) {
    deAssertFail("!FilePath(\"foo\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xda);
  }
  FilePath::FilePath((FilePath *)&local_c0,"\\foo/bar");
  bVar1 = FilePath::isAbsolutePath((FilePath *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (!bVar1) {
    deAssertFail("FilePath(\"\\\\foo/bar\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xdb);
  }
  FilePath::FilePath((FilePath *)&local_c0,"/foo");
  bVar1 = FilePath::isAbsolutePath((FilePath *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (!bVar1) {
    deAssertFail("FilePath(\"/foo\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xdc);
  }
  FilePath::FilePath((FilePath *)&local_c0,"\\");
  bVar1 = FilePath::isAbsolutePath((FilePath *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (!bVar1) {
    deAssertFail("FilePath(\"\\\\\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xdd);
  }
  FilePath::FilePath((FilePath *)&local_c0,"\\\\net\\loc");
  bVar1 = FilePath::isAbsolutePath((FilePath *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (!bVar1) {
    deAssertFail("FilePath(\"\\\\\\\\net\\\\loc\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xde);
  }
  FilePath::FilePath((FilePath *)&local_c0,"C:\\file.txt");
  bVar1 = FilePath::isAbsolutePath((FilePath *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (!bVar1) {
    deAssertFail("FilePath(\"C:\\\\file.txt\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xdf);
  }
  FilePath::FilePath((FilePath *)&local_c0,"c:/file.txt");
  bVar1 = FilePath::isAbsolutePath((FilePath *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (!bVar1) {
    deAssertFail("FilePath(\"c:/file.txt\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,".",(allocator<char> *)&local_78);
  FilePath::FilePath((FilePath *)&local_e0,".//.");
  FilePath::normalize((FilePath *)&local_e0);
  bVar1 = std::operator==(&local_c0,local_e0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (!bVar1) {
    deAssertFail("string(\".\") == FilePath(\".//.\").normalize().getPath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,".",(allocator<char> *)&local_78);
  FilePath::FilePath((FilePath *)&local_e0,".");
  FilePath::normalize((FilePath *)&local_e0);
  bVar1 = std::operator==(&local_c0,local_e0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (!bVar1) {
    deAssertFail("string(\".\") == FilePath(\".\").normalize().getPath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe3);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"..",(allocator<char> *)&local_58);
  std::operator+(&local_e0,&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FilePath::separator_abi_cxx11_);
  std::operator+(&local_c0,&local_e0,"test");
  FilePath::FilePath((FilePath *)&local_98,"foo/../bar/../../test");
  FilePath::normalize((FilePath *)&local_98);
  bVar1 = std::operator==(&local_c0,local_98._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_78);
  if (!bVar1) {
    deAssertFail("(string(\"..\") + FilePath::separator + \"test\") == FilePath(\"foo/../bar/../../test\").normalize().getPath()"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe4);
  }
  std::operator+(&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FilePath::separator_abi_cxx11_,"foo");
  std::operator+(&local_e0,&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FilePath::separator_abi_cxx11_);
  std::operator+(&local_c0,&local_e0,"foo.txt");
  FilePath::FilePath((FilePath *)&local_98,"/foo\\bar/..\\dir\\..\\foo.txt");
  FilePath::normalize((FilePath *)&local_98);
  bVar1 = std::operator==(&local_c0,local_98._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_78);
  if (!bVar1) {
    deAssertFail("(FilePath::separator + \"foo\" + FilePath::separator + \"foo.txt\") == FilePath(\"/foo\\\\bar/..\\\\dir\\\\..\\\\foo.txt\").normalize().getPath()"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe5);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"c:",&local_99);
  std::operator+(&local_98,&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FilePath::separator_abi_cxx11_);
  std::operator+(&local_78,&local_98,"foo");
  std::operator+(&local_e0,&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FilePath::separator_abi_cxx11_);
  std::operator+(&local_c0,&local_e0,"foo.txt");
  FilePath::FilePath(&local_38,"c:/foo\\bar/..\\dir\\..\\foo.txt");
  FilePath::normalize(&local_38);
  bVar1 = std::operator==(&local_c0,local_38.m_path._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    deAssertFail("(string(\"c:\") + FilePath::separator + \"foo\" + FilePath::separator + \"foo.txt\") == FilePath(\"c:/foo\\\\bar/..\\\\dir\\\\..\\\\foo.txt\").normalize().getPath()"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe6);
  }
  std::operator+(&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FilePath::separator_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FilePath::separator_abi_cxx11_);
  std::operator+(&local_78,&local_98,"foo");
  std::operator+(&local_e0,&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FilePath::separator_abi_cxx11_);
  std::operator+(&local_c0,&local_e0,"foo.txt");
  FilePath::FilePath((FilePath *)&local_58,"\\\\foo\\bar/..\\dir\\..\\foo.txt");
  FilePath::normalize((FilePath *)&local_58);
  bVar1 = std::operator==(&local_c0,local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  if (!bVar1) {
    deAssertFail("(FilePath::separator + FilePath::separator + \"foo\" + FilePath::separator + \"foo.txt\") == FilePath(\"\\\\\\\\foo\\\\bar/..\\\\dir\\\\..\\\\foo.txt\").normalize().getPath()"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe7);
  }
  FilePath::FilePath((FilePath *)&local_e0,"foo/bar");
  FilePath::getBaseName_abi_cxx11_(&local_c0,(FilePath *)&local_e0);
  bVar1 = std::operator==(&local_c0,"bar");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (!bVar1) {
    deAssertFail("FilePath(\"foo/bar\" ).getBaseName() == \"bar\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe9);
  }
  FilePath::FilePath((FilePath *)&local_e0,"foo/bar/");
  FilePath::getBaseName_abi_cxx11_(&local_c0,(FilePath *)&local_e0);
  bVar1 = std::operator==(&local_c0,"bar");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (!bVar1) {
    deAssertFail("FilePath(\"foo/bar/\" ).getBaseName() == \"bar\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xea);
  }
  FilePath::FilePath((FilePath *)&local_e0,"foo\\bar");
  FilePath::getBaseName_abi_cxx11_(&local_c0,(FilePath *)&local_e0);
  bVar1 = std::operator==(&local_c0,"bar");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (!bVar1) {
    deAssertFail("FilePath(\"foo\\\\bar\" ).getBaseName() == \"bar\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xeb);
  }
  FilePath::FilePath((FilePath *)&local_e0,"foo\\bar\\");
  FilePath::getBaseName_abi_cxx11_(&local_c0,(FilePath *)&local_e0);
  bVar1 = std::operator==(&local_c0,"bar");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (!bVar1) {
    deAssertFail("FilePath(\"foo\\\\bar\\\\\" ).getBaseName() == \"bar\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xec);
  }
  FilePath::FilePath((FilePath *)&local_e0,"foo/bar");
  FilePath::getDirName_abi_cxx11_(&local_c0,(FilePath *)&local_e0);
  bVar1 = std::operator==(&local_c0,"foo");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (!bVar1) {
    deAssertFail("FilePath(\"foo/bar\" ).getDirName() == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xed);
  }
  FilePath::FilePath((FilePath *)&local_e0,"foo/bar/");
  FilePath::getDirName_abi_cxx11_(&local_c0,(FilePath *)&local_e0);
  bVar1 = std::operator==(&local_c0,"foo");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (!bVar1) {
    deAssertFail("FilePath(\"foo/bar/\" ).getDirName() == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xee);
  }
  FilePath::FilePath((FilePath *)&local_e0,"foo\\bar");
  FilePath::getDirName_abi_cxx11_(&local_c0,(FilePath *)&local_e0);
  bVar1 = std::operator==(&local_c0,"foo");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (!bVar1) {
    deAssertFail("FilePath(\"foo\\\\bar\" ).getDirName() == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xef);
  }
  FilePath::FilePath((FilePath *)&local_e0,"foo\\bar\\");
  FilePath::getDirName_abi_cxx11_(&local_c0,(FilePath *)&local_e0);
  bVar1 = std::operator==(&local_c0,"foo");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (!bVar1) {
    deAssertFail("FilePath(\"foo\\\\bar\\\\\" ).getDirName() == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xf0);
  }
  FilePath::FilePath((FilePath *)&local_e0,"/foo/bar/baz");
  FilePath::getDirName_abi_cxx11_(&local_c0,(FilePath *)&local_e0);
  std::operator+(&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FilePath::separator_abi_cxx11_,"foo");
  std::operator+(&local_98,&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FilePath::separator_abi_cxx11_);
  std::operator+(&local_78,&local_98,"bar");
  _Var2 = std::operator==(&local_c0,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (!_Var2) {
    deAssertFail("FilePath(\"/foo/bar/baz\" ).getDirName() == FilePath::separator + \"foo\" + FilePath::separator + \"bar\""
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xf1);
  }
  return;
}

Assistant:

void FilePath_selfTest (void)
{
	DE_TEST_ASSERT(!FilePath(".").isAbsolutePath());
	DE_TEST_ASSERT(!FilePath("..\\foo").isAbsolutePath());
	DE_TEST_ASSERT(!FilePath("foo").isAbsolutePath());
	DE_TEST_ASSERT(FilePath("\\foo/bar").isAbsolutePath());
	DE_TEST_ASSERT(FilePath("/foo").isAbsolutePath());
	DE_TEST_ASSERT(FilePath("\\").isAbsolutePath());
	DE_TEST_ASSERT(FilePath("\\\\net\\loc").isAbsolutePath());
	DE_TEST_ASSERT(FilePath("C:\\file.txt").isAbsolutePath());
	DE_TEST_ASSERT(FilePath("c:/file.txt").isAbsolutePath());

	DE_TEST_ASSERT(string(".") == FilePath(".//.").normalize().getPath());
	DE_TEST_ASSERT(string(".") == FilePath(".").normalize().getPath());
	DE_TEST_ASSERT((string("..") + FilePath::separator + "test") == FilePath("foo/../bar/../../test").normalize().getPath());
	DE_TEST_ASSERT((FilePath::separator + "foo" + FilePath::separator + "foo.txt") == FilePath("/foo\\bar/..\\dir\\..\\foo.txt").normalize().getPath());
	DE_TEST_ASSERT((string("c:") + FilePath::separator + "foo" + FilePath::separator + "foo.txt") == FilePath("c:/foo\\bar/..\\dir\\..\\foo.txt").normalize().getPath());
	DE_TEST_ASSERT((FilePath::separator + FilePath::separator + "foo" + FilePath::separator + "foo.txt") == FilePath("\\\\foo\\bar/..\\dir\\..\\foo.txt").normalize().getPath());

	DE_TEST_ASSERT(FilePath("foo/bar"		).getBaseName()	== "bar");
	DE_TEST_ASSERT(FilePath("foo/bar/"		).getBaseName()	== "bar");
	DE_TEST_ASSERT(FilePath("foo\\bar"		).getBaseName()	== "bar");
	DE_TEST_ASSERT(FilePath("foo\\bar\\"	).getBaseName()	== "bar");
	DE_TEST_ASSERT(FilePath("foo/bar"		).getDirName()	== "foo");
	DE_TEST_ASSERT(FilePath("foo/bar/"		).getDirName()	== "foo");
	DE_TEST_ASSERT(FilePath("foo\\bar"		).getDirName()	== "foo");
	DE_TEST_ASSERT(FilePath("foo\\bar\\"	).getDirName()	== "foo");
	DE_TEST_ASSERT(FilePath("/foo/bar/baz"	).getDirName()	== FilePath::separator + "foo" + FilePath::separator + "bar");
}